

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  Type TVar4;
  uint uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  EnumValueDescriptor *pEVar8;
  EnumDescriptor *pEVar9;
  string *enum_name;
  string *enum_value_name;
  Descriptor *this_00;
  uint64_t uVar10;
  int64_t iVar11;
  LogMessage *other;
  EnumDescriptor *descriptor_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  AlphaNum *a_04;
  AlphaNum *a_05;
  AlphaNum *a_06;
  AlphaNum *a_07;
  AlphaNum *a_08;
  AlphaNum *a_09;
  AlphaNum *a_10;
  float fVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  allocator local_41a;
  LogFinisher local_419;
  LogMessage local_418;
  AlphaNum local_3e0;
  string local_3b0;
  AlphaNum local_390;
  AlphaNum local_360;
  string local_330;
  AlphaNum local_310;
  AlphaNum local_2e0;
  allocator local_2aa;
  allocator local_2a9;
  AlphaNum local_2a8;
  AlphaNum local_278;
  string local_248;
  AlphaNum local_228;
  AlphaNum local_1f8;
  string local_1c8;
  AlphaNum local_1a8;
  string local_178;
  AlphaNum local_158;
  string local_128;
  allocator local_107;
  allocator local_106;
  allocator local_105;
  float local_104;
  undefined1 local_100 [4];
  float value_1;
  string local_d0;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  double local_a8;
  double value;
  FieldDescriptor *local_98;
  FieldDescriptor *wrapped_field;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  TVar4 = FieldDescriptor::type(descriptor);
  switch(TVar4) {
  case TYPE_DOUBLE:
    dVar14 = FieldDescriptor::default_value_double(local_20);
    local_a8 = dVar14;
    dVar15 = std::numeric_limits<double>::infinity();
    dVar2 = local_a8;
    if ((dVar14 != dVar15) || (NAN(dVar14) || NAN(dVar15))) {
      dVar14 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar14) || (NAN(dVar2) || NAN(-dVar14))) {
        uVar5 = std::isnan(local_a8);
        if ((uVar5 & 1) == 0) {
          strings::AlphaNum::AlphaNum((AlphaNum *)local_100,local_a8);
          StrCat_abi_cxx11_(&local_d0,(protobuf *)local_100,a);
          std::operator+(__return_storage_ptr__,&local_d0,"D");
          std::__cxx11::string::~string((string *)&local_d0);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"double.NaN",&local_ab);
          std::allocator<char>::~allocator((allocator<char> *)&local_ab);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"double.NegativeInfinity",&local_aa);
        std::allocator<char>::~allocator((allocator<char> *)&local_aa);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"double.PositiveInfinity",&local_a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    break;
  case TYPE_FLOAT:
    fVar12 = FieldDescriptor::default_value_float(local_20);
    local_104 = fVar12;
    fVar13 = std::numeric_limits<float>::infinity();
    fVar1 = local_104;
    if ((fVar12 != fVar13) || (NAN(fVar12) || NAN(fVar13))) {
      fVar12 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar12) || (NAN(fVar1) || NAN(-fVar12))) {
        uVar5 = std::isnan((double)(ulong)(uint)local_104);
        if ((uVar5 & 1) == 0) {
          strings::AlphaNum::AlphaNum(&local_158,local_104);
          StrCat_abi_cxx11_(&local_128,(protobuf *)&local_158,a_00);
          std::operator+(__return_storage_ptr__,&local_128,"F");
          std::__cxx11::string::~string((string *)&local_128);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"float.NaN",&local_107);
          std::allocator<char>::~allocator((allocator<char> *)&local_107);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"float.NegativeInfinity",&local_106);
        std::allocator<char>::~allocator((allocator<char> *)&local_106);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"float.PositiveInfinity",&local_105);
      std::allocator<char>::~allocator((allocator<char> *)&local_105);
    }
    break;
  case TYPE_INT64:
    iVar11 = FieldDescriptor::default_value_int64(local_20);
    strings::AlphaNum::AlphaNum(&local_1a8,iVar11);
    StrCat_abi_cxx11_(&local_178,(protobuf *)&local_1a8,a_01);
    std::operator+(__return_storage_ptr__,&local_178,"L");
    std::__cxx11::string::~string((string *)&local_178);
    break;
  case TYPE_UINT64:
    uVar10 = FieldDescriptor::default_value_uint64(local_20);
    strings::AlphaNum::AlphaNum(&local_1f8,uVar10);
    StrCat_abi_cxx11_(&local_1c8,(protobuf *)&local_1f8,a_02);
    std::operator+(__return_storage_ptr__,&local_1c8,"UL");
    std::__cxx11::string::~string((string *)&local_1c8);
    break;
  case TYPE_INT32:
    iVar7 = FieldDescriptor::default_value_int32(local_20);
    strings::AlphaNum::AlphaNum(&local_228,iVar7);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_228,a_03);
    break;
  case TYPE_FIXED64:
    uVar10 = FieldDescriptor::default_value_uint64(local_20);
    strings::AlphaNum::AlphaNum(&local_278,uVar10);
    StrCat_abi_cxx11_(&local_248,(protobuf *)&local_278,a_04);
    std::operator+(__return_storage_ptr__,&local_248,"UL");
    std::__cxx11::string::~string((string *)&local_248);
    break;
  case TYPE_FIXED32:
    uVar6 = FieldDescriptor::default_value_uint32(local_20);
    strings::AlphaNum::AlphaNum(&local_2a8,uVar6);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_2a8,a_05);
    break;
  case TYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool(local_20);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"true",&local_2a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"false",&local_2aa);
      std::allocator<char>::~allocator((allocator<char> *)&local_2aa);
    }
    break;
  case TYPE_STRING:
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,local_20);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    bVar3 = IsWrapperType(local_20);
    if (bVar3) {
      this_00 = FieldDescriptor::message_type(local_20);
      local_98 = Descriptor::field(this_00,0);
      default_value_abi_cxx11_(__return_storage_ptr__,this,local_98);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"null",(allocator *)((long)&value + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
    }
    break;
  case TYPE_BYTES:
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,local_20);
    break;
  case TYPE_UINT32:
    uVar6 = FieldDescriptor::default_value_uint32(local_20);
    strings::AlphaNum::AlphaNum(&local_2e0,uVar6);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_2e0,a_06);
    break;
  case TYPE_ENUM:
    pEVar8 = FieldDescriptor::default_value_enum(local_20);
    pEVar9 = EnumValueDescriptor::type(pEVar8);
    GetClassName_abi_cxx11_(&local_60,(csharp *)pEVar9,descriptor_00);
    std::operator+(&local_40,&local_60,".");
    pEVar8 = FieldDescriptor::default_value_enum(local_20);
    pEVar9 = EnumValueDescriptor::type(pEVar8);
    enum_name = EnumDescriptor::name_abi_cxx11_(pEVar9);
    pEVar8 = FieldDescriptor::default_value_enum(local_20);
    enum_value_name = EnumValueDescriptor::name_abi_cxx11_(pEVar8);
    GetEnumValueName((string *)&wrapped_field,enum_name,enum_value_name);
    std::operator+(__return_storage_ptr__,&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &wrapped_field);
    std::__cxx11::string::~string((string *)&wrapped_field);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    break;
  case TYPE_SFIXED32:
    iVar7 = FieldDescriptor::default_value_int32(local_20);
    strings::AlphaNum::AlphaNum(&local_310,iVar7);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_310,a_07);
    break;
  case TYPE_SFIXED64:
    iVar11 = FieldDescriptor::default_value_int64(local_20);
    strings::AlphaNum::AlphaNum(&local_360,iVar11);
    StrCat_abi_cxx11_(&local_330,(protobuf *)&local_360,a_08);
    std::operator+(__return_storage_ptr__,&local_330,"L");
    std::__cxx11::string::~string((string *)&local_330);
    break;
  case TYPE_SINT32:
    iVar7 = FieldDescriptor::default_value_int32(local_20);
    strings::AlphaNum::AlphaNum(&local_390,iVar7);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_390,a_09);
    break;
  case MAX_TYPE:
    iVar11 = FieldDescriptor::default_value_int64(local_20);
    strings::AlphaNum::AlphaNum(&local_3e0,iVar11);
    StrCat_abi_cxx11_(&local_3b0,(protobuf *)&local_3e0,a_10);
    std::operator+(__return_storage_ptr__,&local_3b0,"L");
    std::__cxx11::string::~string((string *)&local_3b0);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_418,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x193);
    other = internal::LogMessage::operator<<(&local_418,"Unknown field type.");
    internal::LogFinisher::operator=(&local_419,other);
    internal::LogMessage::~LogMessage(&local_418);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41a);
    std::allocator<char>::~allocator((allocator<char> *)&local_41a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return GetClassName(descriptor->default_value_enum()->type()) + "." +
        GetEnumValueName(descriptor->default_value_enum()->type()->name(), descriptor->default_value_enum()->name());
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "double.NaN";
      }
      return StrCat(value) + "D";
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "float.NaN";
      }
      return StrCat(value) + "F";
    }
    case FieldDescriptor::TYPE_INT64:
      return StrCat(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_UINT64:
      return StrCat(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_INT32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return StrCat(descriptor->default_value_uint64()) + "UL";
    case FieldDescriptor::TYPE_FIXED32:
      return StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_UINT32:
      return StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return StrCat(descriptor->default_value_int64()) + "L";
    case FieldDescriptor::TYPE_SINT32:
      return StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return StrCat(descriptor->default_value_int64()) + "L";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}